

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_50a29::SetExpr::dump(SetExpr *this)

{
  bool bVar1;
  const_reference cVar2;
  const_iterator cVar3;
  bool v;
  undefined1 local_50 [8];
  const_iterator __end2;
  undefined1 local_30 [8];
  const_iterator __begin2;
  vector<bool,_std::allocator<bool>_> *__range2;
  char c;
  SetExpr *this_local;
  
  fprintf(_stderr,"[");
  __range2._7_1_ = '\0';
  __begin2.super__Bit_iterator_base._8_8_ = &this->mSetExpr;
  cVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)__begin2.super__Bit_iterator_base._8_8_)
  ;
  __end2.super__Bit_iterator_base._8_8_ = cVar3.super__Bit_iterator_base._M_p;
  __begin2.super__Bit_iterator_base._M_p._0_4_ = cVar3.super__Bit_iterator_base._M_offset;
  local_30 = (undefined1  [8])__end2.super__Bit_iterator_base._8_8_;
  cVar3 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)__begin2.super__Bit_iterator_base._8_8_)
  ;
  local_50 = (undefined1  [8])cVar3.super__Bit_iterator_base._M_p;
  __end2.super__Bit_iterator_base._M_p._0_4_ = cVar3.super__Bit_iterator_base._M_offset;
  while( true ) {
    bVar1 = std::operator!=((_Bit_iterator_base *)local_30,(_Bit_iterator_base *)local_50);
    if (!bVar1) break;
    cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_30);
    if (cVar2) {
      fprintf(_stderr,"%c",(ulong)(uint)(int)__range2._7_1_);
    }
    __range2._7_1_ = __range2._7_1_ + '\x01';
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_30);
  }
  fprintf(_stderr,"]");
  return;
}

Assistant:

virtual void dump() const
	{
		fprintf(stderr, "[");
		char c = 0;
		for (bool v : mSetExpr)
		{
			if (v)
				fprintf(stderr, "%c", c);
			c++;
		}
		fprintf(stderr, "]");
	}